

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnHostChat(RenX_LoggingPlugin *this,Server *server,string_view message)

{
  bool bVar1;
  __sv_type _Var2;
  code *local_b8;
  size_t local_98;
  char *local_90;
  size_t local_78;
  char *local_70;
  undefined1 local_58 [8];
  string msg;
  logFuncType func;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view message_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0xd & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_58,&this->hostChatFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if (!bVar1) {
    RenX::processTags((string *)local_58,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x1508));
    local_78 = _Var2._M_len;
    local_70 = _Var2._M_str;
    RenX::replace_tag(local_58,local_78,local_70,message._M_len,message._M_str);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_b8 = (code *)msg.field_2._8_8_;
    }
    else {
      local_b8 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_98 = _Var2._M_len;
    local_90 = _Var2._M_str;
    (*local_b8)(server,local_98,local_90);
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnHostChat(RenX::Server &server, std::string_view message)
{
	logFuncType func;
	if (RenX_LoggingPlugin::hostChatPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->hostChatFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, message);
		(server.*func)(msg);
	}
}